

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

double __thiscall ON_Xform::GetMappingXforms(ON_Xform *this,ON_Xform *P_xform,ON_Xform *N_xform)

{
  int iVar1;
  long lVar2;
  ON_Xform *pOVar3;
  byte bVar4;
  double dVar5;
  double p;
  double local_28;
  double local_20;
  
  bVar4 = 0;
  local_20 = 0.0;
  local_28 = 0.0;
  iVar1 = Inv((double *)this,(double (*) [4])P_xform,&local_20,&local_28);
  if ((((iVar1 == 4) && (dVar5 = ABS(local_20), 3.308722450213671e-24 < dVar5)) &&
      (dVar5 * 3.308722450213671e-24 < 1.0)) && (dVar5 * 2.220446049250313e-16 < ABS(local_28))) {
    N_xform->m_xform[0][0] = this->m_xform[0][0];
    N_xform->m_xform[0][1] = this->m_xform[1][0];
    N_xform->m_xform[0][2] = this->m_xform[2][0];
    N_xform->m_xform[0][3] = 0.0;
    N_xform->m_xform[1][0] = this->m_xform[0][1];
    N_xform->m_xform[1][1] = this->m_xform[1][1];
    N_xform->m_xform[1][2] = this->m_xform[2][1];
    N_xform->m_xform[1][3] = 0.0;
    N_xform->m_xform[2][0] = this->m_xform[0][2];
    N_xform->m_xform[2][1] = this->m_xform[1][2];
    N_xform->m_xform[2][2] = this->m_xform[2][2];
    N_xform->m_xform[2][3] = 0.0;
    N_xform->m_xform[3][0] = 0.0;
    N_xform->m_xform[3][1] = 0.0;
    N_xform->m_xform[3][2] = 0.0;
    N_xform->m_xform[3][3] = 1.0;
    return local_20;
  }
  pOVar3 = &IdentityTransformation;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    P_xform->m_xform[0][0] = pOVar3->m_xform[0][0];
    pOVar3 = (ON_Xform *)((long)pOVar3 + ((ulong)bVar4 * -2 + 1) * 8);
    P_xform = (ON_Xform *)((long)P_xform + ((ulong)bVar4 * -2 + 1) * 8);
  }
  pOVar3 = &IdentityTransformation;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    N_xform->m_xform[0][0] = pOVar3->m_xform[0][0];
    pOVar3 = (ON_Xform *)((long)pOVar3 + ((ulong)bVar4 * -2 + 1) * 8);
    N_xform = (ON_Xform *)((long)N_xform + ((ulong)bVar4 * -2 + 1) * 8);
  }
  return 0.0;
}

Assistant:

double ON_Xform::GetMappingXforms( ON_Xform& P_xform, ON_Xform& N_xform ) const
{
  double d = 0.0, p = 0.0;
  double dtol = ON_SQRT_EPSILON*ON_SQRT_EPSILON*ON_SQRT_EPSILON;
  if ( 4 == Inv( &m_xform[0][0], P_xform.m_xform, &d, &p ) 
       && fabs(d) > dtol 
       && fabs(d)*dtol < 1.0
       && fabs(p) > ON_EPSILON*fabs(d)
     )
  {
    // Set N_xform = transpose of this (only upper 3x3 matters)
    N_xform.m_xform[0][0] = m_xform[0][0];
    N_xform.m_xform[0][1] = m_xform[1][0]; 
    N_xform.m_xform[0][2] = m_xform[2][0];
    N_xform.m_xform[0][3] = 0.0;

    N_xform.m_xform[1][0] = m_xform[0][1];
    N_xform.m_xform[1][1] = m_xform[1][1];
    N_xform.m_xform[1][2] = m_xform[2][1];
    N_xform.m_xform[1][3] = 0.0;

    N_xform.m_xform[2][0] = m_xform[0][2];
    N_xform.m_xform[2][1] = m_xform[1][2];
    N_xform.m_xform[2][2] = m_xform[2][2];
    N_xform.m_xform[2][3] = 0.0;

    N_xform.m_xform[3][0] = 0.0;
    N_xform.m_xform[3][1] = 0.0;
    N_xform.m_xform[3][2] = 0.0;
    N_xform.m_xform[3][3] = 1.0;
  }
  else
  {
    P_xform = ON_Xform::IdentityTransformation;
    N_xform = ON_Xform::IdentityTransformation;
    d = 0.0;
  }
  return d;
}